

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Vec_Int_t * Gia_ManCollectOneSide(Gia_Man_t *p,int iSide)

{
  int iVar1;
  Vec_Int_t *vNodes_00;
  Gia_Obj_t *pObj_00;
  bool bVar2;
  Vec_Int_t *vNodes;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  int iSide_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManAndNum(p);
  vNodes_00 = Vec_IntAlloc(iVar1);
  Gia_ManIncrementTravId(p);
  vNodes._4_4_ = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar2 = false;
    if ((int)vNodes._4_4_ < iVar1) {
      pGStack_20 = Gia_ManCo(p,vNodes._4_4_);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    if ((vNodes._4_4_ & 1) == iSide) {
      pObj_00 = Gia_ObjFanin0(pGStack_20);
      Gia_ManCollectOneSide_rec(p,pObj_00,vNodes_00);
    }
    vNodes._4_4_ = vNodes._4_4_ + 1;
  }
  return vNodes_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectOneSide( Gia_Man_t * p, int iSide )
{
    Gia_Obj_t * pObj; int i;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManAndNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachPo( p, pObj, i )
        if ( (i & 1) == iSide )
            Gia_ManCollectOneSide_rec( p, Gia_ObjFanin0(pObj), vNodes );
    return vNodes;
}